

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O1

string * __thiscall
google::protobuf::compiler::cpp::ClassName_abi_cxx11_
          (string *__return_storage_ptr__,cpp *this,EnumDescriptor *enum_descriptor,bool qualified)

{
  long lVar1;
  long *plVar2;
  size_type *psVar3;
  string *result;
  string local_30;
  
  if (*(cpp **)(this + 0x18) == (cpp *)0x0) {
    if ((char)enum_descriptor == '\0') {
      plVar2 = *(long **)this;
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      lVar1 = *plVar2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,lVar1,plVar2[1] + lVar1);
    }
    else {
      anon_unknown_0::DotsToColons(&local_30,*(string **)(this + 8));
      plVar2 = (long *)std::__cxx11::string::replace((ulong)&local_30,0,(char *)0x0,0x380f57);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      psVar3 = (size_type *)(plVar2 + 2);
      if ((size_type *)*plVar2 == psVar3) {
        lVar1 = plVar2[3];
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar3;
        *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar2;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar3;
      }
      __return_storage_ptr__->_M_string_length = plVar2[1];
      *plVar2 = (long)psVar3;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_30._M_dataplus._M_p != &local_30.field_2) {
        operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
      }
    }
  }
  else {
    ClassName_abi_cxx11_
              (__return_storage_ptr__,*(cpp **)(this + 0x18),
               (Descriptor *)((ulong)enum_descriptor & 0xff),qualified);
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,**(ulong **)this);
  }
  return __return_storage_ptr__;
}

Assistant:

string ClassName(const EnumDescriptor* enum_descriptor, bool qualified) {
  if (enum_descriptor->containing_type() == NULL) {
    if (qualified) {
      return "::" + DotsToColons(enum_descriptor->full_name());
    } else {
      return enum_descriptor->name();
    }
  } else {
    string result = ClassName(enum_descriptor->containing_type(), qualified);
    result += '_';
    result += enum_descriptor->name();
    return result;
  }
}